

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstr.cpp
# Opt level: O0

LPWSTR lstrcpynW(LPWSTR lpString1,LPCWSTR lpString2,int iMaxLength)

{
  bool bVar1;
  LPWSTR lpStart;
  LPCWSTR pWStack_20;
  int iMaxLength_local;
  LPCWSTR lpString2_local;
  LPWSTR lpString1_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (lpString1 == (LPWSTR)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    lpString1_local = (LPWSTR)0x0;
  }
  else {
    lpStart._4_4_ = iMaxLength;
    pWStack_20 = lpString2;
    lpString2_local = lpString1;
    if (lpString2 == (LPCWSTR)0x0) {
      if (!PAL_InitializeChakraCoreCalled) {
        abort();
      }
      if (!PAL_InitializeChakraCoreCalled) {
        abort();
      }
      lpString1_local = (LPWSTR)0x0;
    }
    else {
      while( true ) {
        bVar1 = false;
        if (1 < lpStart._4_4_) {
          bVar1 = *pWStack_20 != L'\0';
        }
        if (!bVar1) break;
        *lpString2_local = *pWStack_20;
        lpStart._4_4_ = lpStart._4_4_ + -1;
        pWStack_20 = pWStack_20 + 1;
        lpString2_local = lpString2_local + 1;
      }
      if (0 < lpStart._4_4_) {
        *lpString2_local = L'\0';
      }
      lpString1_local = lpString1;
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
  }
  return lpString1_local;
}

Assistant:

LPWSTR
PALAPI
lstrcpynW(
	  OUT LPWSTR lpString1,
	  IN LPCWSTR lpString2,
	  IN int iMaxLength)
{
    LPWSTR lpStart = lpString1;

    PERF_ENTRY(lstrcpynW);
    ENTRY("lstrcpynW (lpString1=%p, lpString2=%p (%S), iMaxLength=%d)\n",
              lpString1?lpString1:W16_NULLSTRING, lpString2?lpString2:W16_NULLSTRING, lpString2?lpString2:W16_NULLSTRING, iMaxLength);

    if (lpString1 == NULL)
    {
        ERROR("invalid lpString1 argument\n");
        LOGEXIT("lstrcpynW returning LPWSTR NULL\n");
        PERF_EXIT(lstrcpynW);
        return NULL;
    }

    if (lpString2 == NULL)
    {
        ERROR("invalid lpString2 argument\n");
        LOGEXIT("lstrcpynW returning LPWSTR NULL\n");
        PERF_EXIT(lstrcpynW);
        return NULL;
    }

    /* copy source string to destination string */
    while(iMaxLength > 1 && *lpString2)
    {
        *lpString1++ = *lpString2++;
        iMaxLength--;
    }

    /* add terminating null */
    if (iMaxLength > 0)
    {
        *lpString1 = '\0';
    }

    LOGEXIT("lstrcpynW returning LPWSTR %p (%S)\n", lpStart, lpStart);
    PERF_EXIT(lstrcpynW);
    return lpStart;

}